

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O1

bool __thiscall
SQFunctionProto::Save(SQFunctionProto *this,SQVM *v,SQUserPointer up,SQWRITEFUNC write)

{
  SQLocalVarInfo *pSVar1;
  bool bVar2;
  SQInteger SVar3;
  long lVar4;
  long lVar5;
  SQInteger nfunctions;
  SQInteger nlocalvarinfos;
  SQInteger noutervalues;
  SQInteger nparameters;
  SQInteger nliterals;
  SQInteger ndefaultparams;
  SQInteger ninstructions;
  SQInteger nlineinfos;
  undefined4 local_7c;
  SQInteger local_78;
  SQInteger local_70;
  SQInteger local_68;
  SQInteger local_60;
  SQInteger local_58;
  long local_50;
  SQInteger local_48;
  SQInteger local_40;
  SQInteger local_38;
  
  local_58 = this->_nliterals;
  local_60 = this->_nparameters;
  local_68 = this->_noutervalues;
  local_70 = this->_nlocalvarinfos;
  local_38 = this->_nlineinfos;
  local_40 = this->_ninstructions;
  local_78 = this->_nfunctions;
  local_48 = this->_ndefaultparams;
  local_7c = 0x50415254;
  SVar3 = (*write)(up,&local_7c,4);
  if (SVar3 == 4) {
    bVar2 = WriteObject(v,up,write,&this->_sourcename);
    if ((!bVar2) || (bVar2 = WriteObject(v,up,write,&this->_name), !bVar2)) {
      return false;
    }
    local_7c = 0x50415254;
    SVar3 = (*write)(up,&local_7c,4);
    if ((((((SVar3 == 4) && (SVar3 = (*write)(up,&local_58,8), SVar3 == 8)) &&
          (SVar3 = (*write)(up,&local_60,8), SVar3 == 8)) &&
         ((SVar3 = (*write)(up,&local_68,8), SVar3 == 8 &&
          (SVar3 = (*write)(up,&local_70,8), SVar3 == 8)))) &&
        ((SVar3 = (*write)(up,&local_38,8), SVar3 == 8 &&
         ((SVar3 = (*write)(up,&local_48,8), SVar3 == 8 &&
          (SVar3 = (*write)(up,&local_40,8), SVar3 == 8)))))) &&
       (SVar3 = (*write)(up,&local_78,8), SVar3 == 8)) {
      local_7c = 0x50415254;
      SVar3 = (*write)(up,&local_7c,4);
      if (SVar3 == 4) {
        if (0 < local_58) {
          lVar5 = 0;
          lVar4 = 0;
          do {
            bVar2 = WriteObject(v,up,write,
                                (SQObjectPtr *)
                                ((long)&(this->_literals->super_SQObject)._type + lVar5));
            if (!bVar2) {
              return false;
            }
            lVar4 = lVar4 + 1;
            lVar5 = lVar5 + 0x10;
          } while (lVar4 < local_58);
        }
        local_7c = 0x50415254;
        SVar3 = (*write)(up,&local_7c,4);
        if (SVar3 == 4) {
          if (0 < local_60) {
            lVar5 = 0;
            lVar4 = 0;
            do {
              bVar2 = WriteObject(v,up,write,
                                  (SQObjectPtr *)
                                  ((long)&(this->_parameters->super_SQObject)._type + lVar5));
              if (!bVar2) {
                return false;
              }
              lVar4 = lVar4 + 1;
              lVar5 = lVar5 + 0x10;
            } while (lVar4 < local_60);
          }
          local_7c = 0x50415254;
          SVar3 = (*write)(up,&local_7c,4);
          if (SVar3 == 4) {
            if (0 < local_68) {
              lVar5 = 0;
              lVar4 = 0;
              do {
                SVar3 = (*write)(up,(SQUserPointer)((long)&this->_outervalues->_type + lVar5),8);
                if (SVar3 != 8) goto LAB_001196c7;
                bVar2 = WriteObject(v,up,write,
                                    (SQObjectPtr *)
                                    ((long)&(this->_outervalues->_src).super_SQObject._type + lVar5)
                                   );
                if (!bVar2) {
                  return false;
                }
                bVar2 = WriteObject(v,up,write,
                                    (SQObjectPtr *)
                                    ((long)&(this->_outervalues->_name).super_SQObject._type + lVar5
                                    ));
                if (!bVar2) {
                  return false;
                }
                lVar4 = lVar4 + 1;
                lVar5 = lVar5 + 0x28;
              } while (lVar4 < local_68);
            }
            local_7c = 0x50415254;
            SVar3 = (*write)(up,&local_7c,4);
            if (SVar3 == 4) {
              if (0 < local_70) {
                lVar4 = 0;
                local_50 = 0;
                do {
                  pSVar1 = this->_localvarinfos;
                  bVar2 = WriteObject(v,up,write,
                                      (SQObjectPtr *)
                                      ((long)&(pSVar1->_name).super_SQObject._type + lVar4));
                  if (!bVar2) {
                    return false;
                  }
                  SVar3 = (*write)(up,(SQUserPointer)((long)&pSVar1->_pos + lVar4),8);
                  if (((SVar3 != 8) ||
                      (SVar3 = (*write)(up,(SQUserPointer)((long)&pSVar1->_start_op + lVar4),8),
                      SVar3 != 8)) ||
                     (SVar3 = (*write)(up,(SQUserPointer)((long)&pSVar1->_end_op + lVar4),8),
                     SVar3 != 8)) goto LAB_001196c7;
                  local_50 = local_50 + 1;
                  lVar4 = lVar4 + 0x28;
                } while (local_50 < local_70);
              }
              local_7c = 0x50415254;
              SVar3 = (*write)(up,&local_7c,4);
              if ((SVar3 == 4) &&
                 (lVar4 = local_38 << 4, SVar3 = (*write)(up,this->_lineinfos,lVar4), SVar3 == lVar4
                 )) {
                local_7c = 0x50415254;
                SVar3 = (*write)(up,&local_7c,4);
                if ((SVar3 == 4) &&
                   (lVar4 = local_48 << 3, SVar3 = (*write)(up,this->_defaultparams,lVar4),
                   SVar3 == lVar4)) {
                  local_7c = 0x50415254;
                  SVar3 = (*write)(up,&local_7c,4);
                  if ((SVar3 == 4) &&
                     (lVar4 = local_40 << 3, SVar3 = (*write)(up,this->_instructions,lVar4),
                     SVar3 == lVar4)) {
                    local_7c = 0x50415254;
                    SVar3 = (*write)(up,&local_7c,4);
                    if (SVar3 == 4) {
                      if (0 < local_78) {
                        lVar5 = 8;
                        lVar4 = 0;
                        do {
                          bVar2 = Save(*(SQFunctionProto **)
                                        ((long)&(this->_functions->super_SQObject)._type + lVar5),v,
                                       up,write);
                          if (!bVar2) {
                            return false;
                          }
                          lVar4 = lVar4 + 1;
                          lVar5 = lVar5 + 0x10;
                        } while (lVar4 < local_78);
                      }
                      SVar3 = (*write)(up,&this->_stacksize,8);
                      if ((SVar3 == 8) && (SVar3 = (*write)(up,&this->_bgenerator,1), SVar3 == 1)) {
                        SVar3 = (*write)(up,&this->_varparams,8);
                        bVar2 = SVar3 == 8;
                        if (bVar2) {
                          return bVar2;
                        }
                        goto LAB_001196d0;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001196c7:
  bVar2 = false;
LAB_001196d0:
  SQVM::Raise_Error(v,"io error (write function failure)");
  return bVar2;
}

Assistant:

bool SQFunctionProto::Save(SQVM *v,SQUserPointer up,SQWRITEFUNC write)
{
    SQInteger i,nliterals = _nliterals,nparameters = _nparameters;
    SQInteger noutervalues = _noutervalues,nlocalvarinfos = _nlocalvarinfos;
    SQInteger nlineinfos=_nlineinfos,ninstructions = _ninstructions,nfunctions=_nfunctions;
    SQInteger ndefaultparams = _ndefaultparams;
    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(WriteObject(v,up,write,_sourcename));
    _CHECK_IO(WriteObject(v,up,write,_name));
    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeWrite(v,write,up,&nliterals,sizeof(nliterals)));
    _CHECK_IO(SafeWrite(v,write,up,&nparameters,sizeof(nparameters)));
    _CHECK_IO(SafeWrite(v,write,up,&noutervalues,sizeof(noutervalues)));
    _CHECK_IO(SafeWrite(v,write,up,&nlocalvarinfos,sizeof(nlocalvarinfos)));
    _CHECK_IO(SafeWrite(v,write,up,&nlineinfos,sizeof(nlineinfos)));
    _CHECK_IO(SafeWrite(v,write,up,&ndefaultparams,sizeof(ndefaultparams)));
    _CHECK_IO(SafeWrite(v,write,up,&ninstructions,sizeof(ninstructions)));
    _CHECK_IO(SafeWrite(v,write,up,&nfunctions,sizeof(nfunctions)));
    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    for(i=0;i<nliterals;i++){
        _CHECK_IO(WriteObject(v,up,write,_literals[i]));
    }

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    for(i=0;i<nparameters;i++){
        _CHECK_IO(WriteObject(v,up,write,_parameters[i]));
    }

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    for(i=0;i<noutervalues;i++){
        _CHECK_IO(SafeWrite(v,write,up,&_outervalues[i]._type,sizeof(SQUnsignedInteger)));
        _CHECK_IO(WriteObject(v,up,write,_outervalues[i]._src));
        _CHECK_IO(WriteObject(v,up,write,_outervalues[i]._name));
    }

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    for(i=0;i<nlocalvarinfos;i++){
        SQLocalVarInfo &lvi=_localvarinfos[i];
        _CHECK_IO(WriteObject(v,up,write,lvi._name));
        _CHECK_IO(SafeWrite(v,write,up,&lvi._pos,sizeof(SQUnsignedInteger)));
        _CHECK_IO(SafeWrite(v,write,up,&lvi._start_op,sizeof(SQUnsignedInteger)));
        _CHECK_IO(SafeWrite(v,write,up,&lvi._end_op,sizeof(SQUnsignedInteger)));
    }

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeWrite(v,write,up,_lineinfos,sizeof(SQLineInfo)*nlineinfos));

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeWrite(v,write,up,_defaultparams,sizeof(SQInteger)*ndefaultparams));

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    _CHECK_IO(SafeWrite(v,write,up,_instructions,sizeof(SQInstruction)*ninstructions));

    _CHECK_IO(WriteTag(v,write,up,SQ_CLOSURESTREAM_PART));
    for(i=0;i<nfunctions;i++){
        _CHECK_IO(_funcproto(_functions[i])->Save(v,up,write));
    }
    _CHECK_IO(SafeWrite(v,write,up,&_stacksize,sizeof(_stacksize)));
    _CHECK_IO(SafeWrite(v,write,up,&_bgenerator,sizeof(_bgenerator)));
    _CHECK_IO(SafeWrite(v,write,up,&_varparams,sizeof(_varparams)));
    return true;
}